

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O1

void qp_free(priority_queue *qp,_func_void_void_ptr *payload_free)

{
  ulong uVar1;
  long lVar2;
  
  if (qp == (priority_queue *)0x0) {
    return;
  }
  if (qp->count <= qp->size) {
    if ((payload_free != (_func_void_void_ptr *)0x0) && (qp->count != 0)) {
      lVar2 = 0;
      uVar1 = 0;
      do {
        (*payload_free)(*(void **)((long)&qp->data->payload + lVar2));
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar1 < qp->count);
    }
    mem_free(qp->data);
    mem_free(qp);
    return;
  }
  __assert_fail("qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-queue.c",
                0x114,"void qp_free(struct priority_queue *, void (*)(void *))");
}

Assistant:

void qp_free(struct priority_queue *qp, void (*payload_free)(void*))
{
	if (!qp) {
		return;
	}
	assert(qp->count <= qp->size);
	if (payload_free) {
		size_t i;

		for (i = 0; i < qp->count; ++i) {
			(*payload_free)(qp->data[i].payload.p);
		}
	}
	mem_free(qp->data);
	mem_free(qp);
}